

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kats_test.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_362e::read_hex
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          string *data)

{
  ulong uVar1;
  uint local_1d4;
  uint c;
  istringstream iss;
  uint auStack_198 [90];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (__return_storage_ptr__,data->_M_string_length >> 1);
  for (uVar1 = 0; uVar1 < data->_M_string_length; uVar1 = uVar1 + 2) {
    std::__cxx11::string::substr((ulong)&c,(ulong)data);
    std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&c,_S_in);
    std::__cxx11::string::~string((string *)&c);
    *(uint *)((long)auStack_198 + *(long *)(_iss + -0x18)) =
         *(uint *)((long)auStack_198 + *(long *)(_iss + -0x18)) & 0xffffffb5 | 8;
    std::istream::_M_extract<unsigned_int>((uint *)&iss);
    local_1d4 = (uint)(byte)c;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_int>
              (__return_storage_ptr__,&local_1d4);
    std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> read_hex(const std::string& data) {
    std::vector<uint8_t> res;
    res.reserve(data.size() / 2);

    for (std::size_t i = 0; i < data.size(); i += 2) {
      std::istringstream iss{data.substr(i, 2)};
      unsigned int c;
      iss >> std::hex >> c;
      res.emplace_back(c & 0xff);
    }
    return res;
  }